

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  ushort uVar5;
  SrcList *pSVar6;
  Expr *pEVar7;
  Expr *pEVar8;
  Bitmask BVar9;
  WhereLoopBuilder *pBuilder_00;
  Parse *pPVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  char *zRight;
  sqlite3_index_info *psVar14;
  ExprList *pEVar15;
  undefined4 uVar16;
  Table *pTVar17;
  long lVar18;
  ExprList *pEVar19;
  int iVar20;
  uint uVar21;
  anon_struct_4_9_b482b7ef_for_fg *paVar22;
  anon_union_8_3_bb5b150a_for_u *paVar23;
  ulong uVar24;
  WhereTerm *pTerm;
  ExprList *pEVar25;
  ExprList *pEVar26;
  u16 uVar27;
  undefined4 uVar28;
  int iVar29;
  ExprList *pEVar30;
  Bitmask mNext;
  ExprList *pEVar31;
  sqlite3_index_constraint *psVar32;
  ushort uVar33;
  ulong uVar34;
  long lVar35;
  bool bVar36;
  int bIn;
  Table *local_90;
  undefined8 local_88;
  uint local_7c;
  ulong local_78;
  Bitmask local_70;
  WhereLoopBuilder *local_68;
  ExprList *local_60;
  uint local_54;
  int local_50;
  int bRetry;
  WhereLoop *local_48;
  Parse *local_40;
  WhereClause *local_38;
  
  bRetry = 0;
  local_88 = pBuilder->pWInfo;
  local_38 = pBuilder->pWC;
  local_40 = local_88->pParse;
  pSVar6 = local_88->pTabList;
  local_48 = pBuilder->pNew;
  bVar2 = local_48->iTab;
  local_60 = local_88->pOrderBy;
  local_90 = pSVar6->a[bVar2].pTab;
  pTerm = local_38->a;
  iVar29 = 0;
  iVar20 = local_38->nTerm;
  local_70 = mPrereq;
  local_68 = pBuilder;
  if (local_38->nTerm < 1) {
    iVar20 = iVar29;
  }
  while (bVar36 = iVar20 != 0, iVar20 = iVar20 + -1, bVar36) {
    uVar3 = pTerm->wtFlags;
    pTerm->wtFlags = uVar3 & 0xffbf;
    if ((((pTerm->leftCursor == pSVar6->a[bVar2].iCursor) && ((pTerm->prereqRight & mUnusable) == 0)
         ) && (-1 < (char)uVar3 && (pTerm->eOperator & 0xf7ff) != 0)) &&
       (((pSVar6->a[bVar2].fg.jointype & 0x58) == 0 ||
        (iVar11 = constraintCompatibleWithOuterJoin(pTerm,pSVar6->a + bVar2), iVar11 != 0)))) {
      iVar29 = iVar29 + 1;
      pTerm->wtFlags = uVar3 | 0x40;
    }
    pTerm = pTerm + 1;
  }
  if (local_60 == (ExprList *)0x0) {
    uVar21 = 0;
    uVar24 = 0;
  }
  else {
    uVar21 = local_60->nExpr;
    local_78 = (ulong)uVar21;
    uVar24 = 0;
    uVar34 = 0;
    pEVar30 = local_60;
    if (0 < (int)uVar21) {
      uVar34 = (ulong)uVar21;
    }
    for (; paVar22 = &pEVar30->a[0].fg, uVar34 != uVar24; uVar24 = uVar24 + 1) {
      pEVar7 = pEVar30->a[0].pExpr;
      iVar20 = sqlite3ExprIsConstant(pEVar7);
      if (iVar20 != 0) goto LAB_001aaef9;
      if ((paVar22->sortFlags & 2) != 0) {
LAB_001aaf11:
        uVar34 = uVar24 & 0xffffffff;
        break;
      }
      if (pEVar7->op != 'q') {
        if ((pEVar7->op == 0xa7) && (pEVar7->iTable == pSVar6->a[bVar2].iCursor)) goto LAB_001aaef9;
        goto LAB_001aaf11;
      }
      pEVar8 = pEVar7->pLeft;
      if ((pEVar8->op != 0xa7) || (pEVar8->iTable != pSVar6->a[bVar2].iCursor)) goto LAB_001aaf11;
      sVar4 = pEVar8->iColumn;
      pEVar7->iColumn = sVar4;
      if (-1 < (long)sVar4) {
        zRight = sqlite3ColumnColl(local_90->aCol + sVar4);
        if (zRight == (char *)0x0) {
          zRight = "BINARY";
        }
        iVar20 = sqlite3_stricmp((pEVar7->u).zToken,zRight);
        if (iVar20 != 0) goto LAB_001aaf11;
      }
LAB_001aaef9:
      pEVar30 = (ExprList *)paVar22;
    }
    if ((int)uVar34 == (int)local_78) {
      uVar3 = local_88->wctrlFlags;
      uVar24 = local_78;
      if ((char)uVar3 < '\0') {
        uVar21 = uVar3 >> 9 & 1 | 2;
      }
      else {
        uVar21 = uVar3 >> 6 & 1;
      }
    }
    else {
      uVar21 = 0;
      uVar24 = 0;
    }
  }
  pPVar10 = local_40;
  lVar35 = (long)iVar29;
  psVar14 = (sqlite3_index_info *)
            sqlite3DbMallocZero(local_40->db,(long)(int)uVar24 * 8 + lVar35 * 0x1c + 0x88);
  if (psVar14 == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pPVar10,"out of memory");
  }
  else {
    psVar32 = (sqlite3_index_constraint *)(&psVar14[1].aConstraintUsage + lVar35);
    local_88 = (WhereInfo *)((long)&psVar14[1].aConstraintUsage + lVar35 * 0x14);
    psVar14->aConstraint = psVar32;
    psVar14->aOrderBy = (sqlite3_index_orderby *)local_88;
    psVar14->aConstraintUsage =
         (sqlite3_index_constraint_usage *)((long)local_88 + (long)(int)uVar24 * 8);
    *(WhereClause **)(psVar14 + 1) = local_38;
    psVar14[1].aConstraint = (sqlite3_index_constraint *)pPVar10;
    psVar14[1].nOrderBy = uVar21;
    *(undefined4 *)&psVar14[1].field_0x14 = 0;
    iVar20 = local_38->nTerm;
    if (local_38->nTerm < 1) {
      iVar20 = 0;
    }
    paVar23 = &local_38->a->u;
    uVar21 = 0;
    local_7c = 0;
    iVar29 = 0;
    pTVar17 = (Table *)psVar14;
    local_90 = (Table *)psVar14;
    local_78 = uVar24;
    for (iVar11 = 0; pPVar10 = local_40, pEVar30 = local_60, iVar20 != iVar11; iVar11 = iVar11 + 1)
    {
      uVar3 = *(u16 *)((long)paVar23 + -0xe);
      if ((uVar3 & 0x40) != 0) {
        lVar18 = (long)iVar29;
        psVar32[lVar18].iColumn = (paVar23->x).leftColumn;
        (&psVar14[1].idxNum)[lVar35 * 2 + lVar18 * 3] = iVar11;
        uVar5 = *(u16 *)((long)paVar23 + -0xc);
        uVar33 = uVar5 & 0x3fff;
        if (uVar33 == 1) {
          if (-1 < (short)uVar3) {
            uVar12 = 1 << ((byte)iVar29 & 0x1f);
            if (0x1f < iVar29) {
              uVar12 = 0;
            }
            uVar21 = uVar21 | uVar12;
            *(uint *)&((sqlite3_index_info *)((long)local_90 + 0x60))->field_0x14 = uVar21;
          }
          psVar32[lVar18].op = '\x02';
        }
        else if (uVar33 == 0x40) {
          psVar32[lVar18].op = *(u8 *)((long)paVar23 + -9);
        }
        else if ((uVar5 & 0x180) == 0) {
          psVar32[lVar18].op = (uchar)uVar5;
          if (((uVar5 & 0x3c) != 0) &&
             (local_54 = uVar21, local_50 = iVar20,
             iVar13 = sqlite3ExprIsVector(((WhereTerm *)(paVar23 + -4))->pExpr->pRight),
             uVar21 = local_54, iVar20 = local_50, iVar13 != 0)) {
            uVar12 = 1 << ((byte)iVar29 & 0x1f);
            if (0xf < iVar29) {
              uVar12 = 0;
            }
            local_7c = local_7c | uVar12;
            if (uVar33 == 4) {
              psVar32[lVar18].op = ' ';
            }
            else if (uVar33 == 0x10) {
              psVar32[lVar18].op = '\b';
            }
          }
        }
        else if (uVar33 == 0x100) {
          psVar32[lVar18].op = 'G';
        }
        else {
          psVar32[lVar18].op = 'H';
        }
        iVar29 = iVar29 + 1;
        pTVar17 = local_90;
      }
      paVar23 = paVar23 + 7;
    }
    ((sqlite3_index_info *)pTVar17)->nConstraint = iVar29;
    uVar34 = 0;
    uVar24 = local_78 & 0xffffffff;
    if ((int)local_78 < 1) {
      uVar24 = uVar34;
    }
    iVar20 = 0;
    for (; pTVar17 = local_90, uVar24 * 0x18 - uVar34 != 0; uVar34 = uVar34 + 0x18) {
      pEVar7 = *(Expr **)((long)&pEVar30->a[0].pExpr + uVar34);
      iVar29 = sqlite3ExprIsConstant(pEVar7);
      if (iVar29 == 0) {
        ((sqlite3_index_orderby *)((long)local_88 + (long)iVar20 * 8))->iColumn =
             (int)pEVar7->iColumn;
        ((sqlite3_index_orderby *)((long)local_88 + (long)iVar20 * 8))->desc =
             (&pEVar30->a[0].fg.sortFlags)[uVar34] & 1;
        iVar20 = iVar20 + 1;
      }
    }
    *(int *)&local_90->pIndex = iVar20;
    local_48->rSetup = 0;
    local_48->wsFlags = 0x400;
    local_48->nLTerm = 0;
    pbVar1 = (byte *)((long)&local_48->u + 4);
    *pbVar1 = *pbVar1 & 0xfe;
    uVar21 = *(uint *)&local_90->zName;
    iVar20 = whereLoopResize(pPVar10->db,local_48,uVar21);
    pBuilder_00 = local_68;
    BVar9 = local_70;
    uVar12 = local_7c;
    if (iVar20 == 0) {
      uVar27 = (u16)local_7c;
      iVar20 = whereLoopAddVirtualOne
                         (local_68,local_70,0xffffffffffffffff,0,(sqlite3_index_info *)pTVar17,
                          (u16)local_7c,&bIn,&bRetry);
      local_88 = (WhereInfo *)(CONCAT44(local_88._4_4_,uVar12) & 0xffffffff0000ffff);
      if (bRetry != 0) {
        iVar20 = whereLoopAddVirtualOne
                           (pBuilder_00,BVar9,0xffffffffffffffff,0,(sqlite3_index_info *)pTVar17,
                            uVar27,&bIn,(int *)0x0);
      }
      if (iVar20 == 0) {
        uVar24 = ~local_70;
        pEVar30 = (ExprList *)(local_48->prereq & uVar24);
        iVar20 = 0;
        if (bIn != 0 || pEVar30 != (ExprList *)0x0) {
          if (bIn == 0) {
            iVar20 = 0;
            uVar12 = 0;
            local_60 = (ExprList *)0x0;
          }
          else {
            iVar20 = whereLoopAddVirtualOne
                               (local_68,local_70,0xffffffffffffffff,1,(sqlite3_index_info *)pTVar17
                                ,(u16)local_88,&bIn,(int *)0x0);
            local_60 = (ExprList *)(local_48->prereq & uVar24);
            uVar12 = (uint)(local_60 == (ExprList *)0x0);
          }
          pEVar25 = (ExprList *)(ulong)uVar21;
          if ((int)uVar21 < 1) {
            pEVar25 = (ExprList *)0x0;
          }
          local_78 = CONCAT44(local_78._4_4_,uVar12);
          local_7c = (uint)(uVar12 == 0);
          pEVar15 = (ExprList *)0x0;
          uVar28 = (undefined4)local_88;
          while( true ) {
            BVar9 = local_70;
            if (iVar20 != 0) break;
            pEVar31 = (ExprList *)0xffffffffffffffff;
            for (lVar35 = 0; (long)pEVar25 * 0xc - lVar35 != 0; lVar35 = lVar35 + 0xc) {
              pEVar19 = (ExprList *)
                        (local_38->a
                         [*(int *)((long)&((sqlite3_index_info *)pTVar17)->aConstraint->iTermOffset
                                  + lVar35)].prereqRight & uVar24);
              pEVar26 = pEVar31;
              if (pEVar19 < pEVar31) {
                pEVar26 = pEVar19;
              }
              if (pEVar15 < pEVar19) {
                pEVar31 = pEVar26;
              }
            }
            iVar20 = 0;
            if (pEVar31 == (ExprList *)0xffffffffffffffff) {
              if ((local_7c & 1) == 0) {
                iVar29 = (int)local_78;
                uVar27 = (u16)uVar28;
              }
              else {
                iVar20 = whereLoopAddVirtualOne
                                   (local_68,local_70,local_70,0,(sqlite3_index_info *)pTVar17,
                                    (u16)local_88,&bIn,(int *)0x0);
                iVar29 = (int)local_78;
                uVar27 = (u16)local_88;
                if (bIn == 0) {
                  iVar29 = 1;
                }
              }
              if (iVar29 == 0 && iVar20 == 0) {
                iVar20 = whereLoopAddVirtualOne
                                   (local_68,local_70,local_70,1,(sqlite3_index_info *)pTVar17,
                                    uVar27,&bIn,(int *)0x0);
              }
              break;
            }
            pEVar15 = pEVar31;
            if ((pEVar31 != pEVar30) && (pEVar31 != local_60)) {
              iVar20 = whereLoopAddVirtualOne
                                 (local_68,local_70,(ulong)pEVar31 | local_70,0,
                                  (sqlite3_index_info *)local_90,(u16)local_88,&bIn,(int *)0x0);
              pTVar17 = local_90;
              uVar28 = (undefined4)local_88;
              if (local_48->prereq == BVar9) {
                uVar16 = (int)local_78;
                if (bIn == 0) {
                  uVar16 = 1;
                }
                local_78 = CONCAT44(local_78._4_4_,uVar16);
                local_7c = 0;
              }
            }
          }
        }
      }
      if (((sqlite3_index_info *)pTVar17)->needToFreeIdxStr != 0) {
        sqlite3_free(((sqlite3_index_info *)pTVar17)->idxStr);
      }
      freeIndexInfo(local_40->db,(sqlite3_index_info *)pTVar17);
      return iVar20;
    }
    freeIndexInfo(pPVar10->db,(sqlite3_index_info *)pTVar17);
  }
  return 7;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  SrcItem *pSrc;               /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;
  int bRetry = 0;              /* True to retry with LIMIT/OFFSET disabled */

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pWInfo, pWC, mUnusable, pSrc, &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    freeIndexInfo(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(
      pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, &bRetry
  );
  if( bRetry ){
    assert( rc==SQLITE_OK );
    rc = whereLoopAddVirtualOne(
        pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, 0
    );
  }

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn, 0);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq)
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn, 0);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  freeIndexInfo(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}